

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUITab * __thiscall
irr::gui::CGUIEnvironment::addTab
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  CGUITab *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUITab *)operator_new(0x160);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUITab::CGUITab(this_00,&this->super_IGUIEnvironment,parent_00,rectangle,id);
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUITab *)this_00;
}

Assistant:

IGUITab *CGUIEnvironment::addTab(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id)
{
	IGUITab *t = new CGUITab(this, parent ? parent : this,
			rectangle, id);
	t->drop();
	return t;
}